

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::SAXParser::docCharacters
          (SAXParser *this,XMLCh *chars,XMLSize_t length,bool cdataSection)

{
  DocumentHandler *pDVar1;
  ulong uVar2;
  
  if ((this->fElemDepth != 0) && (pDVar1 = this->fDocHandler, pDVar1 != (DocumentHandler *)0x0)) {
    (**(code **)(*(long *)pDVar1 + 0x10))(pDVar1,chars,length);
  }
  if (this->fAdvDHCount != 0) {
    uVar2 = 0;
    do {
      (*this->fAdvDHList[uVar2]->_vptr_XMLDocumentHandler[2])
                (this->fAdvDHList[uVar2],chars,length,cdataSection);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->fAdvDHCount);
  }
  return;
}

Assistant:

void SAXParser::docCharacters(  const   XMLCh* const    chars
                                , const XMLSize_t       length
                                , const bool            cdataSection)
{
    // Suppress the chars before the root element.
    if (fElemDepth)
    {
        // Just map to the SAX document handler
        if (fDocHandler)
            fDocHandler->characters(chars, length);
    }

    //
    //  If there are any installed advanced handlers, then lets call them
    //  with this info.
    //
    for (XMLSize_t index = 0; index < fAdvDHCount; index++)
        fAdvDHList[index]->docCharacters(chars, length, cdataSection);
}